

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

VkBool32 VulkanUtilities::anon_unknown_0::DebugMessengerCallback
                   (VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
                   VkDebugUtilsMessageTypeFlagsEXT messageType,
                   VkDebugUtilsMessengerCallbackDataEXT *callbackData,void *userData)

{
  VkDebugUtilsObjectNameInfoEXT *pVVar1;
  VkDebugUtilsLabelEXT *pVVar2;
  undefined *puVar3;
  int iVar4;
  bool bVar5;
  _Setw _Var6;
  pointer ppVar7;
  atomic<int> *paVar8;
  ostream *poVar9;
  char *pcVar10;
  undefined8 uVar11;
  char (*in_R8) [53];
  undefined1 auVar12 [16];
  char *local_2d8;
  string local_2a0 [32];
  undefined8 local_280;
  undefined1 local_278 [8];
  string _msg_1;
  VkDebugUtilsLabelEXT *Label;
  uint32_t l;
  VkDebugUtilsObjectNameInfoEXT *Object;
  stringstream local_228 [4];
  uint32_t obj;
  stringstream debugMessage;
  ostream local_218 [376];
  undefined1 local_a0 [8];
  string _msg;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
  _Stack_78;
  __int_type PrevMsgCount;
  HashMapStringKey local_60;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
  local_50;
  iterator it;
  DEBUG_MESSAGE_SEVERITY MsgSeverity;
  void *userData_local;
  VkDebugUtilsMessengerCallbackDataEXT *callbackData_local;
  VkDebugUtilsMessageTypeFlagsEXT messageType_local;
  VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity_local;
  
  if ((messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT) == 0) {
    if ((messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT) == 0) {
      it.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
      ._M_cur._4_4_ = 0;
    }
    else {
      it.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
      ._M_cur._4_4_ = 1;
    }
  }
  else {
    it.
    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
    ._M_cur._4_4_ = 2;
  }
  if (callbackData->pMessageIdName != (char *)0x0) {
    Diligent::HashMapStringKey::HashMapStringKey(&local_60,callbackData->pMessageIdName,false);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::HashMapStringKey,_std::atomic<int>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>_>
         ::find((unordered_map<Diligent::HashMapStringKey,_std::atomic<int>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>_>
                 *)(anonymous_namespace)::g_IgnoreMessages,&local_60);
    Diligent::HashMapStringKey::~HashMapStringKey(&local_60);
    _Stack_78._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::HashMapStringKey,_std::atomic<int>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>_>
         ::end((unordered_map<Diligent::HashMapStringKey,_std::atomic<int>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>_>
                *)(anonymous_namespace)::g_IgnoreMessages);
    bVar5 = std::__detail::operator!=(&local_50,&stack0xffffffffffffff88);
    if (bVar5) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false,_false>
                             *)&local_50);
      paVar8 = &ppVar7->second;
      LOCK();
      _msg.field_2._12_4_ = (paVar8->super___atomic_base<int>)._M_i;
      (paVar8->super___atomic_base<int>)._M_i = (paVar8->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      if (it.
          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
          ._M_cur._4_4_ != 2) {
        return 0;
      }
      if (_msg.field_2._12_4_ != 0) {
        return 0;
      }
      Diligent::FormatString<char[26],char_const*,char[53]>
                ((string *)local_a0,(Diligent *)"Vulkan Validation error \'",
                 (char (*) [26])&callbackData->pMessageIdName,
                 (char **)"\' is being ignored. This may obfuscate a real issue.",in_R8);
      puVar3 = Diligent::DebugMessageCallback;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        uVar11 = std::__cxx11::string::c_str();
        (*(code *)puVar3)(1,uVar11,0);
      }
      std::__cxx11::string::~string((string *)local_a0);
      return 0;
    }
  }
  std::__cxx11::stringstream::stringstream(local_228);
  std::operator<<(local_218,"Vulkan debug message (");
  if (((messageType & 1) != 0) && (std::operator<<(local_218,"general"), (messageType & 6) != 0)) {
    std::operator<<(local_218,", ");
  }
  if (((messageType & 2) != 0) && (std::operator<<(local_218,"validation"), (messageType & 4) != 0))
  {
    std::operator<<(local_218,", ");
  }
  if ((messageType & 4) != 0) {
    std::operator<<(local_218,"performance");
  }
  std::operator<<(local_218,"): ");
  if (callbackData->pMessageIdName == (char *)0x0) {
    local_2d8 = "<Unknown name>";
  }
  else {
    local_2d8 = callbackData->pMessageIdName;
  }
  std::operator<<(local_218,local_2d8);
  if (callbackData->pMessage != (char *)0x0) {
    poVar9 = (ostream *)std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    poVar9 = std::operator<<(poVar9,"                 ");
    std::operator<<(poVar9,callbackData->pMessage);
  }
  if (callbackData->objectCount != 0) {
    for (Object._4_4_ = 0; Object._4_4_ < callbackData->objectCount; Object._4_4_ = Object._4_4_ + 1
        ) {
      pVVar1 = callbackData->pObjects;
      poVar9 = (ostream *)std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>)
      ;
      poVar9 = std::operator<<(poVar9,"                 Object[");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,Object._4_4_);
      poVar9 = std::operator<<(poVar9,"] (");
      pcVar10 = VkObjectTypeToString(pVVar1[Object._4_4_].objectType);
      poVar9 = std::operator<<(poVar9,pcVar10);
      poVar9 = std::operator<<(poVar9,"): Handle ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::hex);
      poVar9 = std::operator<<(poVar9,"0x");
      std::ostream::operator<<(poVar9,pVVar1[Object._4_4_].objectHandle);
      if (pVVar1[Object._4_4_].pObjectName != (char *)0x0) {
        poVar9 = std::operator<<(local_218,", Name: \'");
        poVar9 = std::operator<<(poVar9,pVVar1[Object._4_4_].pObjectName);
        std::operator<<(poVar9,'\'');
      }
    }
  }
  if (callbackData->cmdBufLabelCount != 0) {
    for (Label._4_4_ = 0; Label._4_4_ < callbackData->cmdBufLabelCount;
        Label._4_4_ = Label._4_4_ + 1) {
      pVVar2 = callbackData->pCmdBufLabels;
      poVar9 = (ostream *)std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>)
      ;
      poVar9 = std::operator<<(poVar9,"                 Label[");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,Label._4_4_);
      std::operator<<(poVar9,"]");
      if (pVVar2[Label._4_4_].pLabelName != (char *)0x0) {
        poVar9 = std::operator<<(local_218," - ");
        std::operator<<(poVar9,pVVar2[Label._4_4_].pLabelName);
      }
      std::operator<<(local_218," {");
      poVar9 = (ostream *)std::ostream::operator<<(local_218,std::fixed);
      _Var6 = std::setw(4);
      poVar9 = std::operator<<(poVar9,_Var6);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pVVar2[Label._4_4_].color[0]);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      _Var6 = std::setw(4);
      poVar9 = std::operator<<(poVar9,_Var6);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pVVar2[Label._4_4_].color[1]);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      _msg_1.field_2._12_4_ = std::setw(4);
      poVar9 = std::operator<<(poVar9,(_Setw)_msg_1.field_2._12_4_);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pVVar2[Label._4_4_].color[2]);
      poVar9 = std::operator<<(poVar9,", ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
      _msg_1.field_2._8_4_ = std::setw(4);
      poVar9 = std::operator<<(poVar9,(_Setw)_msg_1.field_2._8_4_);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pVVar2[Label._4_4_].color[3]);
      std::operator<<(poVar9,"}");
    }
  }
  std::__cxx11::stringstream::str();
  auVar12 = std::__cxx11::string::c_str();
  local_280 = auVar12._0_8_;
  Diligent::FormatString<char_const*>((string *)local_278,(Diligent *)&local_280,auVar12._8_8_);
  std::__cxx11::string::~string(local_2a0);
  iVar4 = it.
          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
          ._M_cur._4_4_;
  puVar3 = Diligent::DebugMessageCallback;
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    uVar11 = std::__cxx11::string::c_str();
    (*(code *)puVar3)(iVar4,uVar11,0);
  }
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::stringstream::~stringstream(local_228);
  return 0;
}

Assistant:

VKAPI_ATTR VkBool32 VKAPI_CALL DebugMessengerCallback(VkDebugUtilsMessageSeverityFlagBitsEXT      messageSeverity,
                                                      VkDebugUtilsMessageTypeFlagsEXT             messageType,
                                                      const VkDebugUtilsMessengerCallbackDataEXT* callbackData,
                                                      void*                                       userData)
{
    auto MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    if (messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_ERROR;
    }
    else if (messageSeverity & VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_WARNING;
    }
    else if (messageSeverity & (VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }
    else
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }

    if (callbackData->pMessageIdName != nullptr)
    {
        auto it = g_IgnoreMessages.find(callbackData->pMessageIdName);
        if (it != g_IgnoreMessages.end())
        {
            const auto PrevMsgCount = it->second.fetch_add(1);
            if (MsgSeverity == DEBUG_MESSAGE_SEVERITY_ERROR && PrevMsgCount == 0)
            {
                LOG_WARNING_MESSAGE("Vulkan Validation error '", callbackData->pMessageIdName, "' is being ignored. This may obfuscate a real issue.");
            }
            return VK_FALSE;
        }
    }

    std::stringstream debugMessage;
    debugMessage << "Vulkan debug message (";
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT)
    {
        debugMessage << "general";
        if (messageType & (VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT))
            debugMessage << ", ";
    }
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT)
    {
        debugMessage << "validation";
        if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT)
            debugMessage << ", ";
    }
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT)
        debugMessage << "performance";
    debugMessage << "): ";

    // callbackData->messageIdNumber is deprecated and starting with version 1.1.85 it is always 0
    debugMessage << (callbackData->pMessageIdName != nullptr ? callbackData->pMessageIdName : "<Unknown name>");
    if (callbackData->pMessage != nullptr)
    {
        debugMessage << std::endl
                     << "                 " << callbackData->pMessage;
    }

    if (callbackData->objectCount > 0)
    {
        for (uint32_t obj = 0; obj < callbackData->objectCount; ++obj)
        {
            const auto& Object = callbackData->pObjects[obj];
            debugMessage << std::endl
                         << "                 Object[" << obj << "] (" << VkObjectTypeToString(Object.objectType)
                         << "): Handle " << std::hex << "0x" << Object.objectHandle;
            if (Object.pObjectName != nullptr)
            {
                debugMessage << ", Name: '" << Object.pObjectName << '\'';
            }
        }
    }

    if (callbackData->cmdBufLabelCount > 0)
    {
        for (uint32_t l = 0; l < callbackData->cmdBufLabelCount; ++l)
        {
            const auto& Label = callbackData->pCmdBufLabels[l];
            debugMessage << std::endl
                         << "                 Label[" << l << "]";
            if (Label.pLabelName != nullptr)
            {
                debugMessage << " - " << Label.pLabelName;
            }
            debugMessage << " {";
            debugMessage << std::fixed << std::setw(4) << Label.color[0] << ", "
                         << std::fixed << std::setw(4) << Label.color[1] << ", "
                         << std::fixed << std::setw(4) << Label.color[2] << ", "
                         << std::fixed << std::setw(4) << Label.color[3] << "}";
        }
    }

    LOG_DEBUG_MESSAGE(MsgSeverity, debugMessage.str().c_str());

    // The return value of this callback controls whether the Vulkan call that caused
    // the validation message will be aborted or not
    // We return VK_FALSE as we DON'T want Vulkan calls that cause a validation message
    // (and return a VkResult) to abort
    return VK_FALSE;
}